

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTreeClauseVariantIndex::insert
          (SubstitutionTreeClauseVariantIndex *this,Clause *cl)

{
  bool bVar1;
  LiteralSubstitutionTree<Indexing::LiteralClause> **ppLVar2;
  LiteralSubstitutionTree<Indexing::LiteralClause> *this_00;
  Literal *pLVar3;
  uint length;
  SubstitutionTreeClauseVariantIndex *this_01;
  ZIArray<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *this_02;
  uint uVar4;
  ulong n;
  List<Kernel::Clause_*> *local_38;
  ClauseList **plist;
  
  uVar4 = (uint)*(ulong *)&cl->field_0x38;
  length = uVar4 & 0xfffff;
  if (length == 1) {
    bVar1 = Kernel::Term::ground(&cl->_literals[0]->super_Term);
    if (bVar1) {
      local_38 = (List<Kernel::Clause_*> *)0x0;
      Lib::
      DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
      getValuePtr(&this->_groundUnits,cl->_literals[0],&plist,&local_38);
      Lib::List<Kernel::Clause_*>::push(cl,plist);
      return;
    }
  }
  else if ((*(ulong *)&cl->field_0x38 & 0xfffff) == 0) {
    Lib::List<Kernel::Clause_*>::push(cl,&this->_emptyClauses);
    return;
  }
  this_02 = &this->_strees;
  n = (ulong)(uVar4 & 0xfffff);
  this_01 = (SubstitutionTreeClauseVariantIndex *)this_02;
  ppLVar2 = Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::operator[]
                      (&this_02->
                        super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,n)
  ;
  if (*ppLVar2 == (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
    this_00 = (LiteralSubstitutionTree<Indexing::LiteralClause> *)::operator_new(0x28);
    LiteralSubstitutionTree<Indexing::LiteralClause>::LiteralSubstitutionTree(this_00);
    this_01 = (SubstitutionTreeClauseVariantIndex *)this_02;
    ppLVar2 = Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::operator[]
                        (&this_02->
                          super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,
                         n);
    *ppLVar2 = this_00;
  }
  pLVar3 = getMainLiteral(this_01,cl->_literals,length);
  ppLVar2 = Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::operator[]
                      (&this_02->
                        super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,n)
  ;
  (*((*ppLVar2)->super_LiteralIndexingStructure<Indexing::LiteralClause>).
    _vptr_LiteralIndexingStructure[2])(*ppLVar2,pLVar3,cl,1);
  return;
}

Assistant:

void SubstitutionTreeClauseVariantIndex::insert(Clause* cl)
{
  unsigned clen=cl->length();

  if(cl->length()==0) {
    ClauseList::push(cl, _emptyClauses);
    return;
  }
  if(cl->length()==1 && (*cl)[0]->ground()) {
    Literal* lit=(*cl)[0];
    ClauseList** plist;
    _groundUnits.getValuePtr(lit, plist,0);
    ClauseList::push(cl, *plist);
    return;
  }

  if(!_strees[clen]) {
    _strees[clen] = new LiteralSubstitutionTree();
  }
  Literal* mainLit=getMainLiteral(cl->literals(), clen);
  _strees[clen]->insert(LiteralClause{ mainLit, cl });
}